

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O2

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::reserve
          (CompressedStorage<double,_int> *this,Index size)

{
  Scalar *pSVar1;
  StorageIndex *pSVar2;
  long size_00;
  long lVar3;
  scoped_array<double> sStack_28;
  scoped_array<int> sStack_20;
  
  size_00 = size + this->m_size;
  if (size_00 <= this->m_allocatedSize) {
    return;
  }
  scoped_array<double>::scoped_array(&sStack_28,size_00);
  scoped_array<int>::scoped_array(&sStack_20,size_00);
  lVar3 = this->m_size;
  if (size_00 <= this->m_size) {
    lVar3 = size_00;
  }
  if (0 < lVar3) {
    memcpy(sStack_28.m_ptr,this->m_values,lVar3 * 8);
    memcpy(sStack_20.m_ptr,this->m_indices,lVar3 << 2);
  }
  pSVar1 = this->m_values;
  this->m_values = sStack_28.m_ptr;
  pSVar2 = this->m_indices;
  this->m_indices = sStack_20.m_ptr;
  this->m_allocatedSize = size_00;
  sStack_28.m_ptr = pSVar1;
  sStack_20.m_ptr = pSVar2;
  scoped_array<int>::~scoped_array(&sStack_20);
  scoped_array<double>::~scoped_array(&sStack_28);
  return;
}

Assistant:

void reserve(Index size)
    {
      Index newAllocatedSize = m_size + size;
      if (newAllocatedSize > m_allocatedSize)
        reallocate(newAllocatedSize);
    }